

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

bool __thiscall QTextDocumentPrivate::unite(QTextDocumentPrivate *this,uint f)

{
  quint32 *pqVar1;
  FragmentMap *this_00;
  long lVar2;
  char16_t cVar3;
  quint32 qVar4;
  quint32 qVar5;
  uint uVar6;
  QTextFragmentData *pQVar7;
  char16_t *pcVar8;
  Header *pHVar9;
  uint z;
  int diff;
  QTextFragmentData *pQVar10;
  uint p;
  ulong uVar11;
  int iVar12;
  
  uVar11 = (ulong)f;
  this_00 = &this->fragments;
  z = QFragmentMapData<QTextFragmentData>::next(&this_00->data,f);
  if (z != 0) {
    pQVar7 = (this_00->data).field_0.fragments;
    if (pQVar7[z].format == pQVar7[uVar11].format) {
      pQVar10 = pQVar7 + uVar11;
      qVar4 = (pQVar10->super_QFragment<1>).size_array[0];
      lVar2 = (long)(int)qVar4 + (long)pQVar10->stringPosition;
      if ((int)lVar2 == pQVar7[z].stringPosition) {
        pcVar8 = (this->text).d.ptr;
        cVar3 = pcVar8[pQVar10->stringPosition];
        if ((ushort)cVar3 - 0xfdd0 < 2) {
          return false;
        }
        if (cVar3 == L'\x2029') {
          return false;
        }
        cVar3 = pcVar8[lVar2];
        if ((ushort)cVar3 - 0xfdd0 < 2) {
          return false;
        }
        if (cVar3 == L'\x2029') {
          return false;
        }
        qVar5 = pQVar7[z].super_QFragment<1>.size_array[0];
        (pQVar10->super_QFragment<1>).size_array[0] = qVar4 + qVar5;
        while (uVar6 = (pQVar10->super_QFragment<1>).parent, uVar6 != 0) {
          pHVar9 = (this_00->data).field_0.head;
          pQVar10 = (QTextFragmentData *)((long)pHVar9 + (ulong)uVar6 * 0x20);
          iVar12 = (int)uVar11;
          uVar11 = (ulong)uVar6;
          if (*(int *)((long)pHVar9 + (ulong)uVar6 * 0x20 + 4) == iVar12) {
            pqVar1 = (pQVar10->super_QFragment<1>).size_left_array;
            *pqVar1 = *pqVar1 + qVar5;
          }
        }
        QFragmentMapData<QTextFragmentData>::erase_single(&this_00->data,z);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool QTextDocumentPrivate::unite(uint f)
{
    uint n = fragments.next(f);
    if (!n)
        return false;

    QTextFragmentData *ff = fragments.fragment(f);
    QTextFragmentData *nf = fragments.fragment(n);

    if (nf->format == ff->format && (ff->stringPosition + (int)ff->size_array[0] == nf->stringPosition)) {
        if (isValidBlockSeparator(text.at(ff->stringPosition))
            || isValidBlockSeparator(text.at(nf->stringPosition)))
            return false;

        fragments.setSize(f, ff->size_array[0] + nf->size_array[0]);
        fragments.erase_single(n);
        return true;
    }
    return false;
}